

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.h
# Opt level: O2

byte * __thiscall
TTD::SlabAllocatorBase<8>::SlabAllocateTypeRawSize<32ul>(SlabAllocatorBase<8> *this)

{
  int32 *piVar1;
  SlabBlock *pSVar2;
  long *plVar3;
  
  if (this->m_reserveActiveBytes != 0) {
    TTDAbort_unrecoverable_error("Don\'t double allocate memory.");
  }
  if ((ulong)this->m_slabBlockSize - 0x49 < 0xffffffffffffffd7) {
    plVar3 = (long *)this->m_currPos;
    if (this->m_endPos < plVar3 + 5) {
      AddNewBlock(this);
      plVar3 = (long *)this->m_currPos;
    }
    this->m_currPos = (byte *)(plVar3 + 5);
    this->m_totalAllocatedSize = this->m_totalAllocatedSize + 0x20;
    pSVar2 = this->m_headBlock;
    *plVar3 = (long)plVar3 - (long)pSVar2;
    piVar1 = &pSVar2->RefCounter;
    *piVar1 = *piVar1 + 1;
    return (byte *)(plVar3 + 1);
  }
  TTDAbort_unrecoverable_error("We can never allocate a block this big with the slab allocator!!");
}

Assistant:

byte* SlabAllocateTypeRawSize()
        {
            TTDAssert(this->m_reserveActiveBytes == 0, "Don't double allocate memory.");
            TTDAssert(n <= TTD_SLAB_LARGE_BLOCK_SIZE, "Don't allocate large requests in the bump pool.");

            uint32 desiredsize = TTD_WORD_ALIGN_ALLOC_SIZE(n + canUnlink); //make alloc size word aligned
            TTDAssert((desiredsize % 4 == 0) & (desiredsize >= (n + canUnlink)) & (desiredsize < TTD_SLAB_BLOCK_USABLE_SIZE(this->m_slabBlockSize)), "We can never allocate a block this big with the slab allocator!!");

            if (this->m_currPos + desiredsize > this->m_endPos)
            {
                this->AddNewBlock();
            }

            byte* res = this->m_currPos;
            this->m_currPos += desiredsize;

#if ENABLE_TTD_INTERNAL_DIAGNOSTICS
            this->m_totalAllocatedSize += TTD_WORD_ALIGN_ALLOC_SIZE(n);
#endif

            if (canUnlink)
            {
                TTDAssert(canUnlink == sizeof(ptrdiff_t), "We need enough space for a ptr to the meta-data.");

                //record the block associated with this allocation
                *((ptrdiff_t*)res) = res - ((byte*)this->m_headBlock);

                res += canUnlink;

                //update the ctr for this block
                this->m_headBlock->RefCounter++;
            }

            return res;
        }